

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,Type type)

{
  long in_FS_OFFSET;
  QCborValue local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->value).n = 0;
  (this->value).container = (QCborContainerPrivate *)0x0;
  (this->value).t = Undefined;
  switch(type) {
  case Null:
    local_28.t = Null;
    break;
  case Bool:
    local_28.t = False;
    break;
  case Double:
    local_28.t = Double;
    break;
  case String:
    local_28.t = String;
    break;
  case Array:
    local_28.t = Array;
    break;
  case Object:
    local_28.t = Map;
    break;
  default:
    goto switchD_001545f7_default;
  }
  local_28.container = (QCborContainerPrivate *)0x0;
  local_28.n = 0;
  QCborValue::operator=(&this->value,&local_28);
  if (local_28.container != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose(&local_28);
  }
switchD_001545f7_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QJsonValue::QJsonValue(Type type)
{
    switch (type) {
    case Null:
        value = QCborValue::Null;
        break;
    case Bool:
        value = QCborValue::False;
        break;
    case Double:
        value = QCborValue::Double;
        break;
    case String:
        value = QCborValue::String;
        break;
    case Array:
        value = QCborValue::Array;
        break;
    case Object:
        value = QCborValue::Map;
        break;
    case Undefined:
        break;
    }
}